

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

bool ul_is_an_mca_channel(UL *ul)

{
  bool bVar1;
  Dictionary *this;
  MDDEntry *pMVar2;
  UL local_28;
  
  bVar1 = true;
  if ((ul->super_Identifier<16U>).m_Value[10] != '\x01') {
    this = ASDCP::DefaultSMPTEDict();
    pMVar2 = ASDCP::Dictionary::Type(this,MDD_AudioChannelSLVS);
    local_28.super_Identifier<16U>.m_HasValue = true;
    local_28.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pMVar2->ul;
    local_28.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pMVar2->ul + 8);
    local_28.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__IArchive_0021d318;
    bVar1 = ASDCP::UL::operator==(ul,&local_28);
  }
  return bVar1;
}

Assistant:

static bool
ul_is_an_mca_channel(const ASDCP::UL& ul)
{
  if ( ul.Value()[10] == 1 ) // magic depends on UL "Essence Facet" byte (see ST 428-12)
    {
      return true;
    }

  if ( ul == ASDCP::DefaultSMPTEDict().ul(ASDCP::MDD_AudioChannelSLVS) ) // not all ULs obey ST 428-12!
    {
      return true;
    }

  return false;
}